

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O3

void __thiscall
Pl_AES_PDF::Pl_AES_PDF
          (Pl_AES_PDF *this,char *identifier,Pipeline *next,bool encrypt,uchar *key,size_t key_bytes
          )

{
  uchar *__dest;
  runtime_error *this_00;
  code *pcVar1;
  undefined *puVar2;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_AES_PDF_002eb188;
  QPDFCryptoProvider::getImpl();
  this->encrypt = encrypt;
  this->cbc_mode = true;
  this->first = true;
  this->offset = 0;
  (this->key)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  this->key_bytes = key_bytes;
  this->use_zero_iv = false;
  this->use_specified_iv = false;
  this->disable_padding = false;
  if (next == (Pipeline *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)this_00,"Attempt to create Pl_AES_PDF with nullptr as next");
    pcVar1 = std::logic_error::~logic_error;
    puVar2 = &std::logic_error::typeinfo;
  }
  else {
    if ((key_bytes == 0x10) || (key_bytes == 0x20)) {
      __dest = (uchar *)operator_new__(key_bytes);
      (this->key)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __dest;
      memcpy(__dest,key,key_bytes);
      this->inbuf[0] = '\0';
      this->inbuf[1] = '\0';
      this->inbuf[2] = '\0';
      this->inbuf[3] = '\0';
      this->inbuf[4] = '\0';
      this->inbuf[5] = '\0';
      this->inbuf[6] = '\0';
      this->inbuf[7] = '\0';
      this->inbuf[8] = '\0';
      this->inbuf[9] = '\0';
      this->inbuf[10] = '\0';
      this->inbuf[0xb] = '\0';
      this->inbuf[0xc] = '\0';
      this->inbuf[0xd] = '\0';
      this->inbuf[0xe] = '\0';
      this->inbuf[0xf] = '\0';
      this->outbuf[0] = '\0';
      this->outbuf[1] = '\0';
      this->outbuf[2] = '\0';
      this->outbuf[3] = '\0';
      this->outbuf[4] = '\0';
      this->outbuf[5] = '\0';
      this->outbuf[6] = '\0';
      this->outbuf[7] = '\0';
      this->outbuf[8] = '\0';
      this->outbuf[9] = '\0';
      this->outbuf[10] = '\0';
      this->outbuf[0xb] = '\0';
      this->outbuf[0xc] = '\0';
      this->outbuf[0xd] = '\0';
      this->outbuf[0xe] = '\0';
      this->outbuf[0xf] = '\0';
      this->cbc_block[0] = '\0';
      this->cbc_block[1] = '\0';
      this->cbc_block[2] = '\0';
      this->cbc_block[3] = '\0';
      this->cbc_block[4] = '\0';
      this->cbc_block[5] = '\0';
      this->cbc_block[6] = '\0';
      this->cbc_block[7] = '\0';
      this->cbc_block[8] = '\0';
      this->cbc_block[9] = '\0';
      this->cbc_block[10] = '\0';
      this->cbc_block[0xb] = '\0';
      this->cbc_block[0xc] = '\0';
      this->cbc_block[0xd] = '\0';
      this->cbc_block[0xe] = '\0';
      this->cbc_block[0xf] = '\0';
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unsupported key length");
    pcVar1 = std::runtime_error::~runtime_error;
    puVar2 = &std::runtime_error::typeinfo;
  }
  __cxa_throw(this_00,puVar2,pcVar1);
}

Assistant:

Pl_AES_PDF::Pl_AES_PDF(
    char const* identifier,
    Pipeline* next,
    bool encrypt,
    unsigned char const* key,
    size_t key_bytes) :
    Pipeline(identifier, next),
    crypto(QPDFCryptoProvider::getImpl()),
    encrypt(encrypt),
    key_bytes(key_bytes)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_AES_PDF with nullptr as next");
    }
    if (!(key_bytes == 32 || key_bytes == 16)) {
        throw std::runtime_error("unsupported key length");
    }
    this->key = std::make_unique<unsigned char[]>(key_bytes);
    std::memcpy(this->key.get(), key, key_bytes);
    std::memset(this->inbuf, 0, this->buf_size);
    std::memset(this->outbuf, 0, this->buf_size);
    std::memset(this->cbc_block, 0, this->buf_size);
}